

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cpp
# Opt level: O3

CollisionType __thiscall
Pipeline::hitCollidable
          (Pipeline *this,TransformationData *pipelineData,Transformation *transformation)

{
  pointer ppCVar1;
  Collidable *pCVar2;
  bool bVar3;
  int iVar4;
  vector<Quad_*,_std::allocator<Quad_*>_> *pvVar5;
  Vec2d *pVVar6;
  CollisionType CVar7;
  Translation *tl;
  pointer ppCVar8;
  byte bVar9;
  
  ppCVar8 = (this->collidables->super__Vector_base<Collidable_*,_std::allocator<Collidable_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->collidables->super__Vector_base<Collidable_*,_std::allocator<Collidable_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar8 == ppCVar1) {
    CVar7 = NONE;
  }
  else {
    bVar9 = 0;
    CVar7 = NONE;
    do {
      pCVar2 = *ppCVar8;
      pvVar5 = TransformationData::getWorkingQuads(pipelineData);
      pVVar6 = TransformationData::getWorkingOffset(pipelineData);
      iVar4 = (*pCVar2->_vptr_Collidable[1])(pCVar2,pvVar5,pVVar6);
      if ((byte)iVar4 != 0) {
        CVar7 = RESTRICT;
      }
      bVar9 = bVar9 | (byte)iVar4;
      ppCVar8 = ppCVar8 + 1;
    } while (ppCVar8 != ppCVar1);
    if (((bVar9 & 1) != 0) &&
       (iVar4 = (*transformation->_vptr_Transformation[2])(transformation), iVar4 == 1)) {
      pVVar6 = Translation::getTranslationVector((Translation *)transformation);
      bVar3 = Vec2d::equals(pVVar6,Vec2d::SOUTH);
      if (bVar3) {
        CVar7 = HALT;
      }
    }
  }
  return CVar7;
}

Assistant:

Collidable::CollisionType Pipeline::hitCollidable(TransformationData& pipelineData, Transformation* transformation) {
    bool collided = false;
    Collidable::CollisionType type = Collidable::NONE;
    Collidable* collider = nullptr;
    for (auto collidable : *collidables) {
        if (collidable->collidesWithQuads(pipelineData.getWorkingQuads(), pipelineData.getWorkingOffset())) {
            collider = collidable;
            collided = true;
            type = Collidable::CollisionType::RESTRICT;
        }
    }
    
    if (collided && transformation->getTransformationType() == TransformationType::TRANSLATION) {
        Translation* tl = static_cast<Translation*>(transformation);
        if (tl->getTranslationVector()->equals(Vec2d::SOUTH)) {
            type = Collidable::CollisionType::HALT;
        }
    }
    
    return type;
}